

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

const_reference __thiscall
google::protobuf::RepeatedField<double>::Get(RepeatedField<double> *this,int index)

{
  bool is_soo;
  int iVar1;
  int iVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  double *pdVar5;
  LogMessage local_58;
  Voidify local_41;
  Nullable<const_char_*> local_40;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  RepeatedField<double> *pRStack_10;
  int index_local;
  RepeatedField<double> *this_local;
  
  absl_log_internal_check_op_result._4_4_ = index;
  pRStack_10 = this;
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue(index);
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20250127::log_internal::Check_GEImpl(iVar1,iVar2,"index >= 0");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x32b,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_1);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
  }
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue
                    (absl_log_internal_check_op_result._4_4_);
  iVar2 = size(this);
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(iVar2);
  local_40 = absl::lts_20250127::log_internal::Check_LTImpl(iVar1,iVar2,"index < size()");
  if (local_40 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_40);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x32c,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  is_soo = RepeatedField<double>::is_soo(this);
  pdVar5 = elements(this,is_soo);
  return pdVar5 + absl_log_internal_check_op_result._4_4_;
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  if constexpr (internal::GetBoundsCheckMode() ==
                internal::BoundsCheckMode::kAbort) {
    internal::RuntimeAssertInBounds(index, size());
  } else {
    ABSL_DCHECK_GE(index, 0);
    ABSL_DCHECK_LT(index, size());
  }
  return elements(is_soo())[index];
}